

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__gif_parse_colortable(stbi__context *s,stbi_uc (*pal) [4],int num_entries,int transp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  stbi_uc sVar3;
  int iVar4;
  stbi_uc *psVar5;
  ulong uVar6;
  
  if (0 < num_entries) {
    psVar1 = s->buffer_start;
    psVar2 = s->buffer_start + 1;
    uVar6 = 0;
    do {
      psVar5 = s->img_buffer;
      if (psVar5 < s->img_buffer_end) {
        s->img_buffer = psVar5 + 1;
        sVar3 = *psVar5;
      }
      else if (s->read_from_callbacks == 0) {
        sVar3 = '\0';
      }
      else {
        iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar4 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          sVar3 = '\0';
          psVar5 = psVar2;
        }
        else {
          sVar3 = *psVar1;
          psVar5 = psVar1 + iVar4;
        }
        s->img_buffer_end = psVar5;
        s->img_buffer = psVar2;
      }
      pal[uVar6][2] = sVar3;
      psVar5 = s->img_buffer;
      if (psVar5 < s->img_buffer_end) {
        s->img_buffer = psVar5 + 1;
        sVar3 = *psVar5;
      }
      else if (s->read_from_callbacks == 0) {
        sVar3 = '\0';
      }
      else {
        iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar4 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          sVar3 = '\0';
          psVar5 = psVar2;
        }
        else {
          sVar3 = *psVar1;
          psVar5 = psVar1 + iVar4;
        }
        s->img_buffer_end = psVar5;
        s->img_buffer = psVar2;
      }
      pal[uVar6][1] = sVar3;
      psVar5 = s->img_buffer;
      if (psVar5 < s->img_buffer_end) {
        s->img_buffer = psVar5 + 1;
        sVar3 = *psVar5;
      }
      else if (s->read_from_callbacks == 0) {
        sVar3 = '\0';
      }
      else {
        iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar4 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          sVar3 = '\0';
          psVar5 = psVar2;
        }
        else {
          sVar3 = *psVar1;
          psVar5 = psVar1 + iVar4;
        }
        s->img_buffer_end = psVar5;
        s->img_buffer = psVar2;
      }
      pal[uVar6][0] = sVar3;
      pal[uVar6][3] = -((uint)transp != uVar6);
      uVar6 = uVar6 + 1;
    } while ((uint)num_entries != uVar6);
  }
  return;
}

Assistant:

static void stbi__gif_parse_colortable(stbi__context *s, stbi_uc pal[256][4], int num_entries, int transp)
{
    int i;
    for (i = 0; i < num_entries; ++i)
    {
        pal[i][2] = stbi__get8(s);
        pal[i][1] = stbi__get8(s);
        pal[i][0] = stbi__get8(s);
        pal[i][3] = transp == i ? 0 : 255;
    }
}